

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall Catch::TestCase::matchesTags(TestCase *this,string *tagPattern)

{
  byte bVar1;
  TagExpressionParser *in_RDI;
  TagExpression exp;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff80;
  TagExpression *in_stack_ffffffffffffff88;
  string *in_stack_ffffffffffffffc8;
  TagParser *in_stack_ffffffffffffffd0;
  
  TagExpression::TagExpression((TagExpression *)0x19f9a3);
  TagExpressionParser::TagExpressionParser
            (in_RDI,(TagExpression *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  TagParser::parse(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  TagExpressionParser::~TagExpressionParser(in_RDI);
  bVar1 = TagExpression::matches(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  TagExpression::~TagExpression((TagExpression *)0x19f9f5);
  return (bool)(bVar1 & 1);
}

Assistant:

bool TestCase::matchesTags( std::string const& tagPattern ) const {
        TagExpression exp;
        TagExpressionParser( exp ).parse( tagPattern );
        return exp.matches( tags );
    }